

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsHeader.cpp
# Opt level: O3

void __thiscall KDReports::Header::setDefaultFont(Header *this,QFont *font)

{
  QTextDocument *pQVar1;
  QFont f;
  QFont local_20 [16];
  
  QFont::QFont(local_20,font);
  QFont::setStyleStrategy((StyleStrategy)local_20);
  pQVar1 = TextDocument::contentDocument
                     (&((this->d)._M_t.
                        super___uniq_ptr_impl<KDReports::HeaderPrivate,_std::default_delete<KDReports::HeaderPrivate>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_KDReports::HeaderPrivate_*,_std::default_delete<KDReports::HeaderPrivate>_>
                        .super__Head_base<0UL,_KDReports::HeaderPrivate_*,_false>._M_head_impl)->
                       m_textDocument);
  QTextDocument::setDefaultFont((QFont *)pQVar1);
  QFont::operator=((QFont *)((long)&((this->d)._M_t.
                                     super___uniq_ptr_impl<KDReports::HeaderPrivate,_std::default_delete<KDReports::HeaderPrivate>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_KDReports::HeaderPrivate_*,_std::default_delete<KDReports::HeaderPrivate>_>
                                     .super__Head_base<0UL,_KDReports::HeaderPrivate_*,_false>.
                                    _M_head_impl)->m_builder + 0x60),local_20);
  QFont::~QFont(local_20);
  return;
}

Assistant:

void KDReports::Header::setDefaultFont(const QFont &font)
{
    QFont f(font);
    f.setStyleStrategy(QFont::ForceOutline); // bitmap fonts look awful in printed documents
    d->m_textDocument.contentDocument().setDefaultFont(f);
    d->m_builder.setDefaultFont(f);
}